

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

PromiseAwaiter<unsigned_long> *
co_await<unsigned_long>
          (PromiseAwaiter<unsigned_long> *__return_storage_ptr__,Promise<unsigned_long> *promise)

{
  PromiseBase node;
  PromiseBase local_10;
  
  local_10.node.ptr = (OwnPromiseNode)(promise->super_PromiseBase).node.ptr;
  (promise->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
  kj::_::PromiseAwaiterBase::PromiseAwaiterBase
            (&__return_storage_ptr__->super_PromiseAwaiterBase,&local_10.node);
  node.node.ptr = local_10.node.ptr;
  (__return_storage_ptr__->result).super_ExceptionOrValue.exception.ptr.isSet = false;
  (__return_storage_ptr__->result).value.ptr.isSet = false;
  if (local_10.node.ptr != (PromiseNode *)0x0) {
    local_10.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node.node.ptr);
  }
  return __return_storage_ptr__;
}

Assistant:

_::PromiseAwaiter<T> operator co_await(Promise<T>& promise) {
  return _::PromiseAwaiter<T>(_::PromiseNode::from(kj::mv(promise)));
}